

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::externalize(Literal *__return_storage_ptr__,Literal *this)

{
  Type *this_00;
  ulong uVar1;
  bool bVar2;
  BasicHeapType BVar3;
  Shareability share;
  HeapType type;
  HeapType type_00;
  HeapType type_01;
  HeapType type_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  initializer_list<wasm::Literal> init;
  SmallVector<wasm::Literal,_1UL> local_c8;
  Literal local_90;
  __shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> local_78;
  shared_ptr<wasm::GCData> local_68;
  __shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<wasm::GCData> local_48;
  HeapType local_38;
  HeapType heapType;
  
  uVar1 = (this->type).id;
  if ((6 < uVar1) && ((uVar1 & 1) == 0)) {
    this_00 = &this->type;
    local_c8.usedFixed = (size_t)wasm::Type::getHeapType(this_00);
    BVar3 = HeapType::getUnsharedTop((HeapType *)&local_c8);
    if (BVar3 == any) {
      local_c8.usedFixed = (size_t)wasm::Type::getHeapType(this_00);
      share = HeapType::getShared((HeapType *)&local_c8);
      bVar2 = wasm::Type::isNull(this_00);
      if (bVar2) {
        local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        BVar3 = HeapType::getBasic((HeapType *)&HeapTypes::noext,share);
        type.id._4_4_ = 0;
        type.id._0_4_ = BVar3;
        Literal(__return_storage_ptr__,&local_48,type);
        this_01 = &local_48.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
      }
      else {
        local_38 = wasm::Type::getHeapType(this_00);
        BVar3 = HeapType::getBasic((HeapType *)&HeapTypes::ext,share);
        bVar2 = HeapType::isMaybeShared(&local_38,i31);
        if (bVar2) {
          Literal(&local_90,this);
          init._M_len = 1;
          init._M_array = &local_90;
          Literals::Literals((Literals *)&local_c8,init);
          std::make_shared<wasm::GCData,wasm::HeapType&,wasm::Literals>
                    ((HeapType *)&local_68,(Literals *)&local_38);
          type_00.id._4_4_ = 0;
          type_00.id._0_4_ = BVar3;
          Literal(__return_storage_ptr__,&local_68,type_00);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_68.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_c8);
          ~Literal(&local_90);
          return __return_storage_ptr__;
        }
        bVar2 = HeapType::isMaybeShared(&local_38,any);
        if (bVar2) {
          std::__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_58,(__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *)this);
          BVar3 = HeapType::getBasic((HeapType *)&HeapTypes::string,share);
          type_01.id._4_4_ = 0;
          type_01.id._0_4_ = BVar3;
          Literal(__return_storage_ptr__,(shared_ptr<wasm::GCData> *)&local_58,type_01);
          this_01 = &local_58._M_refcount;
        }
        else {
          std::__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_78,(__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *)this);
          type_02.id._4_4_ = 0;
          type_02.id._0_4_ = BVar3;
          Literal(__return_storage_ptr__,(shared_ptr<wasm::GCData> *)&local_78,type_02);
          this_01 = &local_78._M_refcount;
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
      return __return_storage_ptr__;
    }
  }
  __assert_fail("type.isRef() && type.getHeapType().getUnsharedTop() == HeapType::any && \"can only externalize internal references\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0xb44,"Literal wasm::Literal::externalize() const");
}

Assistant:

Literal Literal::externalize() const {
  assert(type.isRef() && type.getHeapType().getUnsharedTop() == HeapType::any &&
         "can only externalize internal references");
  auto share = type.getHeapType().getShared();
  if (isNull()) {
    return Literal(std::shared_ptr<GCData>{}, HeapTypes::noext.getBasic(share));
  }
  auto heapType = type.getHeapType();
  auto extType = HeapTypes::ext.getBasic(share);
  if (heapType.isMaybeShared(HeapType::i31)) {
    return Literal(std::make_shared<GCData>(heapType, Literals{*this}),
                   extType);
  }
  if (heapType.isMaybeShared(HeapType::any)) {
    // Anyref literals turn into strings (if we add any other anyref literals,
    // we will need to be more careful here).
    return Literal(gcData, HeapTypes::string.getBasic(share));
  }
  return Literal(gcData, extType);
}